

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

bool duckdb::AllConflictsMeetCondition(DataChunk *result)

{
  ulong uVar1;
  reference pvVar2;
  ulong uVar3;
  
  DataChunk::Flatten(result);
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&result->data,0);
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (result->count == uVar3) break;
    uVar1 = uVar3 + 1;
  } while (pvVar2->data[uVar3] != '\0');
  return result->count <= uVar3;
}

Assistant:

bool AllConflictsMeetCondition(DataChunk &result) {
	result.Flatten();
	auto data = FlatVector::GetData<bool>(result.data[0]);
	for (idx_t i = 0; i < result.size(); i++) {
		if (!data[i]) {
			return false;
		}
	}
	return true;
}